

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O2

uint __thiscall Kernel::Signature::getArrayConstructor(Signature *this)

{
  Symbol *this_00;
  uint uVar1;
  OperatorType *type;
  uint in_R8D;
  initializer_list<Kernel::TermList> sorts;
  bool added;
  allocator<char> local_39;
  string local_38;
  
  added = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Array",&local_39);
  uVar1 = addTypeCon(this,&local_38,2,&added);
  std::__cxx11::string::~string((string *)&local_38);
  if (added == true) {
    this->_arrayCon = uVar1;
    local_38._M_dataplus._M_p = (pointer)AtomicSort::superSort();
    this_00 = (this->_typeCons)._stack[uVar1];
    sorts._M_len = (size_type)local_38._M_dataplus._M_p;
    sorts._M_array = (iterator)0x2;
    local_38._M_string_length = (size_type)local_38._M_dataplus._M_p;
    type = OperatorType::getFunctionType((OperatorType *)&local_38,sorts,(TermList)0x0,in_R8D);
    Symbol::setType(this_00,type);
  }
  return uVar1;
}

Assistant:

unsigned getArrayConstructor(){
    bool added = false;
    unsigned array = addTypeCon("Array",2, added);
    if(added){
      _arrayCon = array;
      TermList ss = AtomicSort::superSort();
      Symbol* arr = getTypeCon(array);
      arr->setType(OperatorType::getFunctionType({ss, ss}, ss));
    }
    return array;    
  }